

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

Database_Result * __thiscall
Database::RawQuery(Database_Result *__return_storage_ptr__,Database *this,char *query,
                  bool tx_control)

{
  impl_ iVar1;
  _Hash_node_base *__s;
  bool bVar2;
  int i_00;
  int iVar3;
  Database_QueryFailed *pDVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  size_type sVar10;
  mapped_type *this_00;
  reference this_01;
  anon_union_8_2_1ccce1b9_for_impl__0 *paVar11;
  char *pcVar12;
  Database *pDVar13;
  allocator<char> local_1a1;
  key_type local_1a0;
  allocator<char> local_179;
  string local_178;
  undefined1 local_158 [8];
  variant rescell;
  undefined1 local_110 [4];
  int ii;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  resrow;
  MYSQL_ROW row;
  int i;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_a0;
  int local_9c;
  int query_result;
  int myerr_2;
  string *q;
  iterator __end5;
  iterator __begin5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  int myerr_1;
  Database_OpenFailed *e;
  int recovery_attempt;
  int myerr;
  int num_fields;
  MYSQL_FIELD *fields;
  MYSQL_RES *mresult;
  size_t query_length;
  bool tx_control_local;
  char *query_local;
  Database *this_local;
  Database_Result *result;
  
  if ((this->connected & 1U) == 0) {
    pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
    Database_QueryFailed::Database_QueryFailed(pDVar4,"Not connected to database.");
    __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,Database_QueryFailed::~Database_QueryFailed);
  }
  sVar5 = strlen(query);
  Database_Result::Database_Result(__return_storage_ptr__);
  if (this->engine == MySQL) {
    fields = (MYSQL_FIELD *)0x0;
LAB_0015488a:
    paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                         (&this->impl)->field_0;
    iVar3 = mysql_real_query(paVar11->mysql_handle,query,sVar5);
    if (iVar3 != 0) {
      paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                           (&this->impl)->field_0;
      iVar3 = mysql_errno(paVar11->mysql_handle);
      e._4_4_ = 0;
      if (((iVar3 != 0x7d6) && (iVar3 != 0x7dd)) && (iVar3 != 0x4b5)) {
        pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
        paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                   operator->(&this->impl)->field_0;
        pcVar12 = (char *)mysql_error(paVar11->mysql_handle);
        Database_QueryFailed::Database_QueryFailed(pDVar4,pcVar12);
        __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,
                    Database_QueryFailed::~Database_QueryFailed);
      }
      while( true ) {
        do {
          e._4_4_ = e._4_4_ + 1;
          if (10 < (int)e._4_4_) {
            Console::Err("Could not re-connect to database. Halting server.");
            std::terminate();
          }
          Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)",
                       (ulong)e._4_4_);
          pDVar13 = this;
          Close(this);
          util::sleep((uint)pDVar13);
          Connect(this,this->engine,&this->host,(unsigned_short)this->port,&this->user,&this->pass,
                  &this->db);
        } while ((this->connected & 1U) == 0);
        if ((this->in_transaction & 1U) == 0) break;
        paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                   operator->(&this->impl)->field_0;
        iVar3 = mysql_real_query(paVar11->mysql_handle,"START TRANSACTION",0x11);
        if (iVar3 == 0) {
          __end5 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->transaction_log);
          q = (string *)
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->transaction_log);
          while( true ) {
            bVar2 = std::operator!=(&__end5,(_Self *)&q);
            if (!bVar2) goto LAB_0015488a;
            _query_result =
                 std::
                 _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end5);
            local_9c = 0;
            paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                       operator->(&this->impl)->field_0;
            iVar1.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)paVar11->mysql_handle;
            uVar6 = std::__cxx11::string::c_str();
            uVar7 = std::__cxx11::string::length();
            local_a0 = mysql_real_query(iVar1.field_0,uVar6,uVar7);
            if (local_a0 == 0) {
              paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                         operator->(&this->impl)->field_0;
              fields = (MYSQL_FIELD *)mysql_use_result(paVar11->mysql_handle);
            }
            paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                       operator->(&this->impl)->field_0;
            local_9c = mysql_errno(paVar11->mysql_handle);
            if (((local_9c == 0x7d6) || (local_9c == 0x7dd)) || (local_9c == 0x4b5)) break;
            if (local_9c != 0) {
              paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                         operator->(&this->impl)->field_0;
              uVar6 = mysql_error(paVar11->mysql_handle);
              Console::Err("Error during recovery: %s",uVar6);
              Console::Err("Halting server.");
              std::terminate();
            }
            if (fields != (MYSQL_FIELD *)0x0) {
              mysql_free_result(fields);
              fields = (MYSQL_FIELD *)0x0;
            }
            std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end5);
          }
        }
        else {
          paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                     operator->(&this->impl)->field_0;
          iVar3 = mysql_errno(paVar11->mysql_handle);
          if (((iVar3 != 0x7d6) && (iVar3 != 0x7dd)) && (iVar3 != 0x4b5)) {
            paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                       operator->(&this->impl)->field_0;
            uVar6 = mysql_error(paVar11->mysql_handle);
            Console::Err("Error during recovery: %s",uVar6);
            Console::Err("Halting server.");
            std::terminate();
          }
        }
      }
      goto LAB_0015488a;
    }
    if ((((this->in_transaction & 1U) != 0) && (!tx_control)) &&
       (iVar3 = strncmp(query,"SELECT",6), iVar3 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,query,(allocator<char> *)((long)&i_1 + 3));
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->transaction_log,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
    }
    paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                         (&this->impl)->field_0;
    iVar3 = mysql_field_count(paVar11->mysql_handle);
    paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                         (&this->impl)->field_0;
    lVar8 = mysql_store_result(paVar11->mysql_handle);
    if (lVar8 == 0) {
      if (iVar3 != 0) {
        pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
        paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::
                   operator->(&this->impl)->field_0;
        pcVar12 = (char *)mysql_error(paVar11->mysql_handle);
        Database_QueryFailed::Database_QueryFailed(pDVar4,pcVar12);
        __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,
                    Database_QueryFailed::~Database_QueryFailed);
      }
      paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                           (&this->impl)->field_0;
      iVar3 = mysql_affected_rows(paVar11->mysql_handle);
      __return_storage_ptr__->affected_rows = iVar3;
    }
    else {
      lVar9 = mysql_fetch_fields(lVar8);
      for (row._4_4_ = 0; row._4_4_ < iVar3; row._4_4_ = row._4_4_ + 1) {
        if (*(long *)(lVar9 + (long)row._4_4_ * 0x80) == 0) {
          pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
          Database_QueryFailed::Database_QueryFailed(pDVar4,"libMySQL critical failure!");
          __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,
                      Database_QueryFailed::~Database_QueryFailed);
        }
      }
      sVar10 = mysql_num_rows(lVar8);
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::resize(&__return_storage_ptr__->
                super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
               ,sVar10);
      row._0_4_ = 0;
      resrow._M_h._M_single_bucket = (__node_base_ptr)mysql_fetch_row(lVar8);
      while (resrow._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         *)local_110);
        for (rescell._60_4_ = 0; (int)rescell._60_4_ < iVar3; rescell._60_4_ = rescell._60_4_ + 1) {
          util::variant::variant((variant *)local_158);
          if (((*(int *)(lVar9 + (long)(int)rescell._60_4_ * 0x80 + 0x70) < 10) &&
              (*(int *)(lVar9 + (long)(int)rescell._60_4_ * 0x80 + 0x70) != 7)) ||
             ((*(int *)(lVar9 + (long)(int)rescell._60_4_ * 0x80 + 0x70) == 0xd ||
              (*(int *)(lVar9 + (long)(int)rescell._60_4_ * 0x80 + 0x70) == 0xf6)))) {
            if (resrow._M_h._M_single_bucket[(int)rescell._60_4_]._M_nxt == (_Hash_node_base *)0x0)
            {
              util::variant::operator=((variant *)local_158,0);
            }
            else {
              __s = resrow._M_h._M_single_bucket[(int)rescell._60_4_]._M_nxt;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_178,(char *)__s,&local_179);
              i_00 = util::to_int(&local_178);
              util::variant::operator=((variant *)local_158,i_00);
              std::__cxx11::string::~string((string *)&local_178);
              std::allocator<char>::~allocator(&local_179);
            }
          }
          else if (resrow._M_h._M_single_bucket[(int)rescell._60_4_]._M_nxt ==
                   (_Hash_node_base *)0x0) {
            util::variant::operator=((variant *)local_158,"");
          }
          else {
            util::variant::operator=
                      ((variant *)local_158,
                       (char *)resrow._M_h._M_single_bucket[(int)rescell._60_4_]._M_nxt);
          }
          pcVar12 = *(char **)(lVar9 + (long)(int)rescell._60_4_ * 0x80);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,pcVar12,&local_1a1);
          this_00 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                  *)local_110,&local_1a0);
          util::variant::operator=(this_00,(variant *)local_158);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
          util::variant::~variant((variant *)local_158);
        }
        sVar10 = (size_type)(int)row;
        row._0_4_ = (int)row + 1;
        this_01 = std::
                  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  ::operator[](&__return_storage_ptr__->
                                super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                               ,sVar10);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ::operator=(this_01,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             *)local_110);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          *)local_110);
        resrow._M_h._M_single_bucket = (__node_base_ptr)mysql_fetch_row(lVar8);
      }
      mysql_free_result(lVar8);
    }
  }
  else {
    if (this->engine != SQLite) {
      pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
      Database_QueryFailed::Database_QueryFailed(pDVar4,"Unknown database engine");
      __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,Database_QueryFailed::~Database_QueryFailed
                 );
    }
    paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                         (&this->impl)->field_0;
    iVar3 = sqlite3_exec(paVar11->mysql_handle,query,sqlite_callback,this,0);
    if (iVar3 != 0) {
      pDVar4 = (Database_QueryFailed *)__cxa_allocate_exception(0x10);
      paVar11 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                           (&this->impl)->field_0;
      pcVar12 = (char *)sqlite3_errmsg(paVar11->mysql_handle);
      Database_QueryFailed::Database_QueryFailed(pDVar4,pcVar12);
      __cxa_throw(pDVar4,&Database_QueryFailed::typeinfo,Database_QueryFailed::~Database_QueryFailed
                 );
    }
    Database_Result::operator=(__return_storage_ptr__,&this->callbackdata);
    std::
    vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
    ::clear(&(this->callbackdata).
             super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           );
  }
  return __return_storage_ptr__;
}

Assistant:

Database_Result Database::RawQuery(const char* query, bool tx_control)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::size_t query_length = std::strlen(query);

	Database_Result result;

#ifdef DATABASE_DEBUG
	Console::Dbg("%s", query);
#endif // DATABASE_DEBUG

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
		{
			MYSQL_RES* mresult = nullptr;
			MYSQL_FIELD* fields = nullptr;
			int num_fields = 0;

			exec_query:
			if (mysql_real_query(this->impl->mysql_handle, query, query_length) != 0)
			{
				int myerr = mysql_errno(this->impl->mysql_handle);
				int recovery_attempt = 0;

				if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
				{
					server_gone:

					if (++recovery_attempt > 10)
					{
						Console::Err("Could not re-connect to database. Halting server.");
						std::terminate();
					}

					Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)", recovery_attempt);
					this->Close();
					util::sleep(2.0 * recovery_attempt);

					try
					{
						this->Connect(this->engine, this->host, this->port, this->user, this->pass, this->db);
					}
					catch (const Database_OpenFailed& e)
					{
						Console::Err("Connection failed: %s", e.error());
					}

					if (!this->connected)
					{
						goto server_gone;
					}

					if (this->in_transaction)
					{
#ifdef DEBUG
						Console::Dbg("Replaying %i queries.", this->transaction_log.size());
#endif // DEBUG

						if (mysql_real_query(this->impl->mysql_handle, "START TRANSACTION", std::strlen("START TRANSACTION")) != 0)
						{
							int myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
						}

						for (const std::string& q : this->transaction_log)
						{
#ifdef DATABASE_DEBUG
							Console::Dbg("%s", q.c_str());
#endif // DATABASE_DEBUG
							int myerr = 0;
							int query_result = mysql_real_query(this->impl->mysql_handle, q.c_str(), q.length());

							if (query_result == 0)
							{
								mresult = mysql_use_result(this->impl->mysql_handle);
							}

							myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else if (myerr)
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
							else
							{
								if (mresult)
								{
									mysql_free_result(mresult);
									mresult = nullptr;
								}
							}
						}
					}

					goto exec_query;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			if (this->in_transaction && !tx_control)
			{
				using namespace std;

				if (strncmp(query, "SELECT", 6) != 0)
					this->transaction_log.emplace_back(std::string(query));
			}

			num_fields = mysql_field_count(this->impl->mysql_handle);

			if ((mresult = mysql_store_result(this->impl->mysql_handle)) == 0)
			{
				if (num_fields == 0)
				{
					result.affected_rows = mysql_affected_rows(this->impl->mysql_handle);
					return result;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			fields = mysql_fetch_fields(mresult);

			for (int i = 0; i < num_fields; ++i)
			{
				if (!fields[i].name)
				{
					throw Database_QueryFailed("libMySQL critical failure!");
				}
			}

			result.resize(mysql_num_rows(mresult));
			int i = 0;
			for (MYSQL_ROW row = mysql_fetch_row(mresult); row != 0; row = mysql_fetch_row(mresult))
			{
				std::unordered_map<std::string, util::variant> resrow;
				for (int ii = 0; ii < num_fields; ++ii)
				{
					util::variant rescell;
					if (IS_NUM(fields[ii].type))
					{
						if (row[ii])
						{
							rescell = util::to_int(row[ii]);
						}
						else
						{
							rescell = 0;
						}
					}
					else
					{
						if (row[ii])
						{
							rescell = row[ii];
						}
						else
						{
							rescell = "";
						}
					}
					resrow[fields[ii].name] = rescell;
				}
				result[i++] = resrow;
			}

			mysql_free_result(mresult);
		}
		break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_exec(this->impl->sqlite_handle, query, sqlite_callback, (void *)this, 0) != SQLITE_OK)
			{
				throw Database_QueryFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}
			result = this->callbackdata;
			this->callbackdata.clear();
			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_QueryFailed("Unknown database engine");
	}

	return result;
}